

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32 drmp3_seek_forward_by_pcm_frames__brute_force(drmp3 *pMP3,drmp3_uint64 frameOffset)

{
  drmp3_uint64 dVar1;
  drmp3_uint64 framesRead;
  drmp3_uint64 frameOffset_local;
  drmp3 *pMP3_local;
  
  dVar1 = drmp3_read_pcm_frames_f32(pMP3,frameOffset,(float *)0x0);
  pMP3_local._4_4_ = (uint)(dVar1 == frameOffset);
  return pMP3_local._4_4_;
}

Assistant:

static drmp3_bool32 drmp3_seek_forward_by_pcm_frames__brute_force(drmp3* pMP3, drmp3_uint64 frameOffset)
{
    drmp3_uint64 framesRead;

    /*
    Just using a dumb read-and-discard for now. What would be nice is to parse only the header of the MP3 frame, and then skip over leading
    frames without spending the time doing a full decode. I cannot see an easy way to do this in minimp3, however, so it may involve some
    kind of manual processing.
    */
#if defined(DR_MP3_FLOAT_OUTPUT)
    framesRead = drmp3_read_pcm_frames_f32(pMP3, frameOffset, NULL);
#else
    framesRead = drmp3_read_pcm_frames_s16(pMP3, frameOffset, NULL);
#endif
    if (framesRead != frameOffset) {
        return DRMP3_FALSE;
    }

    return DRMP3_TRUE;
}